

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.hpp
# Opt level: O0

int __thiscall
mcts::RandomPlayout<uttt::IBoard>::operator()(RandomPlayout<uttt::IBoard> *this,IBoard *game)

{
  int iVar1;
  undefined8 *in_RSI;
  IBoard *in_RDI;
  vector<long,_std::allocator<long>_> moves;
  int status;
  IBoard ngame;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  result_type_conflict1 in_stack_ffffffffffffff94;
  vector<long,_std::allocator<long>_> *this_00;
  undefined4 in_stack_ffffffffffffffa0;
  result_type in_stack_ffffffffffffffa4;
  vector<long,_std::allocator<long>_> local_50;
  int local_38;
  int32_t local_34;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  if (operator()(uttt::IBoard_const&)::rd == '\0') {
    iVar1 = __cxa_guard_acquire(&operator()(uttt::IBoard_const&)::rd);
    if (iVar1 != 0) {
      std::random_device::random_device
                ((random_device *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      __cxa_atexit(std::random_device::~random_device,&operator()::rd,&__dso_handle);
      __cxa_guard_release(&operator()(uttt::IBoard_const&)::rd);
    }
  }
  if (operator()(uttt::IBoard_const&)::gen == '\0') {
    iVar1 = __cxa_guard_acquire(&operator()(uttt::IBoard_const&)::gen);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffa4 = std::random_device::operator()((random_device *)0x24b9d2);
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::mersenne_twister_engine
                ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                  *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      __cxa_guard_release(&operator()(uttt::IBoard_const&)::gen);
    }
  }
  local_34 = (int32_t)*in_RSI;
  local_38 = uttt::IBoard::GetStatus((IBoard *)&local_34);
  while (local_38 == -1) {
    this_00 = &local_50;
    uttt::IBoard::GetPossibleMoves(in_RDI);
    std::vector<long,_std::allocator<long>_>::size(this_00);
    std::uniform_int_distribution<int>::uniform_int_distribution
              ((uniform_int_distribution<int> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff94 =
         std::uniform_int_distribution<int>::operator()
                   ((uniform_int_distribution<int> *)
                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                     *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::vector<long,_std::allocator<long>_>::operator[](&local_50,(long)in_stack_ffffffffffffff94);
    uttt::IBoard::ApplyMove
              ((IBoard *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (IMove *)this_00);
    in_stack_ffffffffffffff90 = uttt::IBoard::GetStatus((IBoard *)&local_34);
    local_38 = in_stack_ffffffffffffff90;
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  return local_38;
}

Assistant:

int
RandomPlayout<IGame>::operator()(const IGame &game) const
{
    static std::random_device rd;
    static std::mt19937 gen(rd());

    auto ngame(game);
    int status = ngame.GetStatus();
    while (status == game::Undecided)
    {
        auto moves = ngame.GetPossibleMoves();
        ngame.ApplyMove(moves[std::uniform_int_distribution<>(0, moves.size() - 1)(gen)]);
        status = ngame.GetStatus();
    }
    return status;
}